

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadAnimations(OgreBinarySerializer *this,Mesh *mesh)

{
  bool bVar1;
  Animation *this_00;
  float fVar2;
  string local_58;
  Animation *local_28;
  Animation *anim;
  Mesh *pMStack_18;
  uint16_t id;
  Mesh *mesh_local;
  OgreBinarySerializer *this_local;
  
  pMStack_18 = mesh;
  mesh_local = (Mesh *)this;
  bVar1 = AtEnd(this);
  if (!bVar1) {
    anim._6_2_ = ReadHeader(this,true);
    while (bVar1 = AtEnd(this), !bVar1 && anim._6_2_ == 0xd100) {
      this_00 = (Animation *)operator_new(0x70);
      Ogre::Animation::Animation(this_00,pMStack_18);
      local_28 = this_00;
      ReadLine_abi_cxx11_(&local_58,this);
      std::__cxx11::string::operator=((string *)&local_28->name,(string *)&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      fVar2 = Read<float>(this);
      local_28->length = fVar2;
      ReadAnimation(this,local_28);
      std::vector<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>::push_back
                (&pMStack_18->animations,&local_28);
      bVar1 = AtEnd(this);
      if (!bVar1) {
        anim._6_2_ = ReadHeader(this,true);
      }
    }
    bVar1 = AtEnd(this);
    if (!bVar1) {
      RollbackHeader(this);
    }
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadAnimations(Mesh *mesh)
{
    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        while (!AtEnd() && id == M_ANIMATION)
        {
            Animation *anim = new Animation(mesh);
            anim->name = ReadLine();
            anim->length = Read<float>();

            ReadAnimation(anim);

            mesh->animations.push_back(anim);

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }
}